

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_prefix_coding.h
# Opt level: O0

decoder_tables * __thiscall
lzham::prefix_coding::decoder_tables::operator=(decoder_tables *this,decoder_tables *other)

{
  uint *puVar1;
  unsigned_short *puVar2;
  decoder_tables *in_RSI;
  decoder_tables *in_RDI;
  decoder_tables *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    clear(in_RDI);
    memcpy(in_RDI,in_RSI,0xc0);
    if (in_RSI->m_lookup != (uint32 *)0x0) {
      puVar1 = lzham_new_array<unsigned_int>((uint32)((ulong)in_RSI >> 0x20));
      in_RDI->m_lookup = puVar1;
      memcpy(in_RDI->m_lookup,in_RSI->m_lookup,(ulong)in_RDI->m_cur_lookup_size << 2);
    }
    local_8 = in_RDI;
    if (in_RSI->m_sorted_symbol_order != (uint16 *)0x0) {
      puVar2 = lzham_new_array<unsigned_short>((uint32)((ulong)in_RSI >> 0x20));
      in_RDI->m_sorted_symbol_order = puVar2;
      memcpy(in_RDI->m_sorted_symbol_order,in_RSI->m_sorted_symbol_order,
             (ulong)in_RDI->m_cur_sorted_symbol_order_size << 1);
      local_8 = in_RDI;
    }
  }
  return local_8;
}

Assistant:

decoder_tables& operator= (const decoder_tables& other)
         {
            if (this == &other)
               return *this;

            clear();

            memcpy(this, &other, sizeof(*this));

            if (other.m_lookup)
            {
               m_lookup = lzham_new_array<uint32>(m_cur_lookup_size);
               memcpy(m_lookup, other.m_lookup, sizeof(m_lookup[0]) * m_cur_lookup_size);
            }

            if (other.m_sorted_symbol_order)
            {
               m_sorted_symbol_order = lzham_new_array<uint16>(m_cur_sorted_symbol_order_size);
               memcpy(m_sorted_symbol_order, other.m_sorted_symbol_order, sizeof(m_sorted_symbol_order[0]) * m_cur_sorted_symbol_order_size);
            }

            return *this;
         }